

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

void xmlInitializeCatalog(void)

{
  xmlCatalogPtr pxVar1;
  char *pcVar2;
  xmlCatalogPtr pxVar3;
  xmlChar *URL;
  xmlCatalogEntryPtr pxVar4;
  bool bVar5;
  xmlCatalogEntryPtr local_38;
  xmlCatalogEntryPtr *nextent;
  xmlCatalogPtr catal;
  char *paths;
  char *cur;
  char *path;
  char *catalogs;
  
  if (xmlCatalogInitialized == 0) {
    xmlInitializeCatalogData();
    xmlRMutexLock(xmlCatalogMutex);
    pcVar2 = getenv("XML_DEBUG_CATALOG");
    if (pcVar2 != (char *)0x0) {
      xmlDebugCatalogs = 1;
    }
    pxVar1 = xmlDefaultCatalog;
    if (xmlDefaultCatalog == (xmlCatalogPtr)0x0) {
      path = getenv("XML_CATALOG_FILES");
      if (path == (char *)0x0) {
        path = "file:///etc/xml/catalog";
      }
      pxVar3 = xmlCreateNewCatalog(XML_XML_CATALOG_TYPE,xmlCatalogDefaultPrefer);
      pxVar1 = xmlDefaultCatalog;
      if (pxVar3 != (xmlCatalogPtr)0x0) {
        paths = path;
        local_38 = (xmlCatalogEntryPtr)&pxVar3->xml;
        while (pxVar1 = pxVar3, *paths != '\0') {
          while( true ) {
            pcVar2 = paths;
            bVar5 = true;
            if ((*paths != ' ') && ((*paths < '\t' || (bVar5 = true, '\n' < *paths)))) {
              bVar5 = *paths == '\r';
            }
            if (!bVar5) break;
            paths = paths + 1;
          }
          if (*paths != '\0') {
            while( true ) {
              bVar5 = false;
              if (*paths != '\0') {
                bVar5 = true;
                if ((*paths != ' ') && ((*paths < '\t' || (bVar5 = true, '\n' < *paths)))) {
                  bVar5 = *paths == '\r';
                }
                bVar5 = (bool)(bVar5 ^ 1);
              }
              if (!bVar5) break;
              paths = paths + 1;
            }
            URL = xmlStrndup((xmlChar *)pcVar2,(int)paths - (int)pcVar2);
            if (URL != (xmlChar *)0x0) {
              pxVar4 = xmlNewCatalogEntry(XML_CATA_CATALOG,(xmlChar *)0x0,(xmlChar *)0x0,URL,
                                          xmlCatalogDefaultPrefer,(xmlCatalogEntryPtr)0x0);
              local_38->next = pxVar4;
              if (local_38->next != (xmlCatalogEntryPtr)0x0) {
                local_38 = local_38->next;
              }
              (*xmlFree)(URL);
            }
          }
        }
      }
    }
    xmlDefaultCatalog = pxVar1;
    xmlRMutexUnlock(xmlCatalogMutex);
  }
  return;
}

Assistant:

void
xmlInitializeCatalog(void) {
    if (xmlCatalogInitialized != 0)
	return;

    xmlInitializeCatalogData();
    xmlRMutexLock(xmlCatalogMutex);

    if (getenv("XML_DEBUG_CATALOG"))
	xmlDebugCatalogs = 1;

    if (xmlDefaultCatalog == NULL) {
	const char *catalogs;
	char *path;
	const char *cur, *paths;
	xmlCatalogPtr catal;
	xmlCatalogEntryPtr *nextent;

	catalogs = (const char *) getenv("XML_CATALOG_FILES");
	if (catalogs == NULL)
#if defined(_WIN32) && defined(_MSC_VER)
    {
		void* hmodule;
		hmodule = GetModuleHandleA("libxml2.dll");
		if (hmodule == NULL)
			hmodule = GetModuleHandleA(NULL);
		if (hmodule != NULL) {
			char buf[256];
			unsigned long len = GetModuleFileNameA(hmodule, buf, 255);
			if (len != 0) {
				char* p = &(buf[len]);
				while (*p != '\\' && p > buf)
					p--;
				if (p != buf) {
					xmlChar* uri;
					strncpy(p, "\\..\\etc\\catalog", 255 - (p - buf));
					uri = xmlCanonicPath((const xmlChar*)buf);
					if (uri != NULL) {
						strncpy(XML_XML_DEFAULT_CATALOG, uri, 255);
						xmlFree(uri);
					}
				}
			}
		}
		catalogs = XML_XML_DEFAULT_CATALOG;
    }
#else
	    catalogs = XML_XML_DEFAULT_CATALOG;
#endif

	catal = xmlCreateNewCatalog(XML_XML_CATALOG_TYPE,
		xmlCatalogDefaultPrefer);
	if (catal != NULL) {
	    /* the XML_CATALOG_FILES envvar is allowed to contain a
	       space-separated list of entries. */
	    cur = catalogs;
	    nextent = &catal->xml;
	    while (*cur != '\0') {
		while (xmlIsBlank_ch(*cur))
		    cur++;
		if (*cur != 0) {
		    paths = cur;
		    while ((*cur != 0) && (!xmlIsBlank_ch(*cur)))
			cur++;
		    path = (char *) xmlStrndup((const xmlChar *)paths, cur - paths);
		    if (path != NULL) {
			*nextent = xmlNewCatalogEntry(XML_CATA_CATALOG, NULL,
				NULL, BAD_CAST path, xmlCatalogDefaultPrefer, NULL);
			if (*nextent != NULL)
			    nextent = &((*nextent)->next);
			xmlFree(path);
		    }
		}
	    }
	    xmlDefaultCatalog = catal;
	}
    }

    xmlRMutexUnlock(xmlCatalogMutex);
}